

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O0

void Minisat::parseOptions(int *argc,char **argv,bool strict)

{
  undefined8 uVar1;
  FILE *__stream;
  bool bVar2;
  Size SVar3;
  int iVar4;
  vec<Minisat::Option_*,_int> *pvVar5;
  Option **ppOVar6;
  char **ppcVar7;
  byte in_DL;
  long in_RSI;
  int *in_RDI;
  undefined1 unaff_retaddr;
  char **in_stack_00000008;
  int in_stack_00000014;
  int k;
  bool parsed_ok;
  char *str;
  int j;
  int i;
  int local_30;
  byte local_29;
  char *local_28;
  int local_1c;
  int local_18;
  byte local_11;
  long local_10;
  int *local_8;
  
  local_11 = in_DL & 1;
  local_1c = 1;
  local_18 = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    if (*local_8 <= local_18) {
      *local_8 = *local_8 - (local_18 - local_1c);
      return;
    }
    local_28 = *(char **)(local_10 + (long)local_18 * 8);
    bVar2 = match<char_const*>(&local_28,"--");
    if (bVar2) {
      ppcVar7 = Option::getHelpPrefixString();
      bVar2 = match<char_const*>(&local_28,*ppcVar7);
      if ((!bVar2) || (bVar2 = match<char_const*>(&local_28,"help"), !bVar2)) goto LAB_00a46399;
      if (*local_28 == '\0') {
        printUsageAndExit(in_stack_00000014,in_stack_00000008,(bool)unaff_retaddr);
      }
      else {
        bVar2 = match<char_const*>(&local_28,"-verb");
        if (bVar2) {
          printUsageAndExit(in_stack_00000014,in_stack_00000008,(bool)unaff_retaddr);
        }
      }
    }
    else {
LAB_00a46399:
      local_29 = 0;
      local_30 = 0;
      while( true ) {
        bVar2 = false;
        if (local_29 == 0) {
          pvVar5 = Option::getOptionList();
          SVar3 = vec<Minisat::Option_*,_int>::size(pvVar5);
          bVar2 = local_30 < SVar3;
        }
        if (!bVar2) break;
        pvVar5 = Option::getOptionList();
        ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,local_30);
        iVar4 = (*(*ppOVar6)->_vptr_Option[2])
                          (*ppOVar6,*(undefined8 *)(local_10 + (long)local_18 * 8));
        local_29 = (byte)iVar4 & 1;
        local_30 = local_30 + 1;
      }
      if (local_29 == 0) {
        if (((local_11 & 1) != 0) &&
           (bVar2 = match<char*>((char **)(local_10 + (long)local_18 * 8),"-"), __stream = _stderr,
           bVar2)) {
          uVar1 = *(undefined8 *)(local_10 + (long)local_18 * 8);
          ppcVar7 = Option::getHelpPrefixString();
          fprintf(__stream,"ERROR! Unknown flag \"%s\". Use \'--%shelp\' for help.\n",uVar1,*ppcVar7
                 );
          exit(1);
        }
        *(undefined8 *)(local_10 + (long)local_1c * 8) =
             *(undefined8 *)(local_10 + (long)local_18 * 8);
        local_1c = local_1c + 1;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void Minisat::parseOptions(int& argc, char** argv, bool strict)
{
    int i, j;
    for (i = j = 1; i < argc; i++){
        const char* str = argv[i];
        if (match(str, "--") && match(str, Option::getHelpPrefixString()) && match(str, "help")){
            if (*str == '\0')
                printUsageAndExit(argc, argv);
            else if (match(str, "-verb"))
                printUsageAndExit(argc, argv, true);
        } else {
            bool parsed_ok = false;
        
            for (int k = 0; !parsed_ok && k < Option::getOptionList().size(); k++){
                parsed_ok = Option::getOptionList()[k]->parse(argv[i]);

                // fprintf(stderr, "checking %d: %s against flag <%s> (%s)\n", i, argv[i], Option::getOptionList()[k]->name, parsed_ok ? "ok" : "skip");
            }

            if (!parsed_ok){
                if (strict && match(argv[i], "-"))
                    fprintf(stderr, "ERROR! Unknown flag \"%s\". Use '--%shelp' for help.\n", argv[i], Option::getHelpPrefixString()), exit(1);
                else
                    argv[j++] = argv[i];
            }
        }
    }

    argc -= (i - j);
}